

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O3

int PreLoopInitialize(VP8Encoder *enc)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  VP8BitWriter *bw;
  
  bVar1 = "2\x18\x10\t\a\x05\x03\x02"[enc->base_quant_ >> 4];
  iVar5 = enc->mb_w_;
  iVar2 = enc->mb_h_;
  iVar3 = enc->num_parts_;
  if (iVar3 < 1) {
    iVar4 = 1;
  }
  else {
    bw = enc->parts_;
    lVar6 = 0;
    do {
      iVar4 = VP8BitWriterInit(bw,(long)((int)((uint)bVar1 * iVar5 * iVar2) / iVar3));
      if (iVar4 == 0) {
        VP8EncFreeBitWriters(enc);
        iVar5 = WebPEncodingSetError(enc->pic_,VP8_ENC_ERROR_OUT_OF_MEMORY);
        return iVar5;
      }
      lVar6 = lVar6 + 1;
      bw = bw + 1;
    } while (lVar6 < enc->num_parts_);
  }
  return iVar4;
}

Assistant:

static int PreLoopInitialize(VP8Encoder* const enc) {
  int p;
  int ok = 1;
  const int average_bytes_per_MB = kAverageBytesPerMB[enc->base_quant_ >> 4];
  const int bytes_per_parts =
      enc->mb_w_ * enc->mb_h_ * average_bytes_per_MB / enc->num_parts_;
  // Initialize the bit-writers
  for (p = 0; ok && p < enc->num_parts_; ++p) {
    ok = VP8BitWriterInit(enc->parts_ + p, bytes_per_parts);
  }
  if (!ok) {
    VP8EncFreeBitWriters(enc);  // malloc error occurred
    return WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return ok;
}